

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall
absl::numbers_internal::safe_strtou32_base
          (numbers_internal *this,string_view text,Nonnull<uint32_t_*> value,int base)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  
  pbVar7 = (byte *)text._M_len;
  *(uint *)text._M_str = 0;
  if (pbVar7 != (byte *)0x0) {
    pbVar10 = pbVar7;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[*pbVar10] & 8) == 0) break;
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 < pbVar7 + (long)this);
    }
    do {
      if (pbVar7 + (long)this <= pbVar10) {
        return false;
      }
      pbVar5 = pbVar7 + -1 + (long)this;
      this = this + -1;
    } while (((&ascii_internal::kPropertyBits)[*pbVar5] & 8) != 0);
    bVar1 = *pbVar10;
    pbVar5 = pbVar7 + (long)this + 1;
    if (((bVar1 != 0x2d) && (bVar1 != 0x2b)) || (pbVar10 = pbVar10 + 1, pbVar10 < pbVar5)) {
      iVar4 = (int)value;
      if (iVar4 == 0x10) {
        pbVar6 = pbVar7 + (long)this + 1;
        value = (Nonnull<uint32_t_*>)0x10;
        if (((1 < (long)(pbVar7 + (long)this + (1 - (long)pbVar10))) && (*pbVar10 == 0x30)) &&
           (((pbVar10[1] | 0x20) == 0x78 && (pbVar10 = pbVar10 + 2, pbVar5 <= pbVar10)))) {
          return false;
        }
      }
      else if (iVar4 == 0) {
        pbVar6 = pbVar7 + (long)this + 1;
        if (((long)(pbVar7 + (long)this) - (long)pbVar10) + 1 < 2) {
          value = (Nonnull<uint32_t_*>)0xa;
          if ((long)(pbVar7 + (long)this) - (long)pbVar10 == 0) {
            bVar2 = *pbVar10;
            pbVar10 = pbVar10 + (bVar2 == 0x30);
            value = (Nonnull<uint32_t_*>)(ulong)((uint)(bVar2 != 0x30) * 2 + 8);
          }
        }
        else if (*pbVar10 == 0x30) {
          if ((pbVar10[1] | 0x20) == 0x78) {
            pbVar10 = pbVar10 + 2;
            if (pbVar5 <= pbVar10) {
              return false;
            }
            value = (Nonnull<uint32_t_*>)0x10;
          }
          else {
            pbVar10 = pbVar10 + 1;
            value = (Nonnull<uint32_t_*>)0x8;
          }
        }
        else {
          value = (Nonnull<uint32_t_*>)0xa;
        }
      }
      else {
        pbVar6 = pbVar5;
        if (0x22 < iVar4 - 2U) {
          return false;
        }
      }
      if (bVar1 != 0x2d) {
        uVar9 = 0;
        if ((uint)(0xffffffff / ((ulong)value & 0xffffffff)) !=
            *(uint *)((anonymous_namespace)::LookupTables<unsigned_int>::kVmaxOverBase +
                     ((ulong)value & 0xffffffff) * 4)) {
          __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                        ,0x3df,
                        "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned int]"
                       );
        }
        bVar3 = true;
        if (0 < (long)pbVar6 - (long)pbVar10) {
          pbVar7 = pbVar10 + ((long)pbVar6 - (long)pbVar10);
          uVar9 = 0;
          do {
            uVar11 = (uint)(char)(anonymous_namespace)::kAsciiToInt[*pbVar10];
            if ((uint)value <= uVar11) {
              bVar3 = false;
              break;
            }
            if ((*(uint *)((anonymous_namespace)::LookupTables<unsigned_int>::kVmaxOverBase +
                          ((ulong)value & 0xffffffff) * 4) < uVar9) ||
               (uVar8 = uVar9 * (uint)value, uVar9 = uVar8 + uVar11, CARRY4(uVar8,uVar11))) {
              bVar3 = false;
              uVar9 = 0xffffffff;
              break;
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 < pbVar7);
        }
        *(uint *)text._M_str = uVar9;
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool safe_strtou32_base(absl::string_view text, absl::Nonnull<uint32_t*> value,
                        int base) {
  return safe_uint_internal<uint32_t>(text, value, base);
}